

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O2

void loguru::add_callback
               (char *id,log_handler_t callback,void *user_data,Verbosity verbosity,
               close_handler_t on_close,flush_handler_t on_flush)

{
  allocator<char> local_81;
  Callback local_80;
  
  std::recursive_mutex::lock((recursive_mutex *)s_mutex);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,id,&local_81);
  local_80.indentation = 0;
  local_80.callback = callback;
  local_80.user_data = user_data;
  local_80.verbosity = verbosity;
  local_80.close = on_close;
  local_80.flush = on_flush;
  std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>::emplace_back<loguru::Callback>
            ((vector<loguru::Callback,_std::allocator<loguru::Callback>_> *)&s_callbacks,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  on_callback_change();
  pthread_mutex_unlock((pthread_mutex_t *)s_mutex);
  return;
}

Assistant:

void add_callback(
		const char*     id,
		log_handler_t   callback,
		void*           user_data,
		Verbosity       verbosity,
		close_handler_t on_close,
		flush_handler_t on_flush)
	{
		std::lock_guard<std::recursive_mutex> lock(s_mutex);
		s_callbacks.push_back(Callback{id, callback, user_data, verbosity, on_close, on_flush, 0});
		on_callback_change();
	}